

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rotating_log.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ece36::mock_file_system_traits::mock_file_system_traits
          (mock_file_system_traits *this)

{
  mock_file_system_traits *this_local;
  
  testing::internal::
  FunctionMocker<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::FunctionMocker(&this->gmock01_exists_32);
  testing::internal::
  FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::FunctionMocker(&this->gmock01_unlink_33);
  testing::internal::
  FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::FunctionMocker(&this->gmock02_rename_34);
  return;
}

Assistant:

mock_file_system_traits () {}